

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

QAbstractItemView * __thiscall QFileDialogPrivate::currentView(QFileDialogPrivate *this)

{
  QStackedWidget *this_00;
  Ui_QFileDialog *pUVar1;
  QWidget *pQVar2;
  QFileDialogListView *pQVar3;
  
  this_00 = ((this->qFileDialogUi).d)->stackedWidget;
  if (this_00 == (QStackedWidget *)0x0) {
    pQVar3 = (QFileDialogListView *)0x0;
  }
  else {
    pQVar2 = QStackedWidget::currentWidget(this_00);
    pUVar1 = (this->qFileDialogUi).d;
    pQVar3 = pUVar1->listView;
    if (pQVar2 != *(QWidget **)
                   (*(long *)&((QWidget *)
                              &(pQVar3->super_QListView).super_QAbstractItemView.
                               super_QAbstractScrollArea)->field_0x8 + 0x10)) {
      pQVar3 = (QFileDialogListView *)pUVar1->treeView;
    }
  }
  return (QAbstractItemView *)pQVar3;
}

Assistant:

QAbstractItemView *QFileDialogPrivate::currentView() const {
    if (!qFileDialogUi->stackedWidget)
        return nullptr;
    if (qFileDialogUi->stackedWidget->currentWidget() == qFileDialogUi->listView->parent())
        return qFileDialogUi->listView;
    return qFileDialogUi->treeView;
}